

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::WaitStatementSyntax::getChild(WaitStatementSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  undefined8 in_RDX;
  long in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff88;
  TokenOrSyntax *in_stack_ffffffffffffff90;
  nullptr_t in_stack_ffffffffffffff98;
  
  switch(in_RDX) {
  case 0:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case 1:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x20),in_stack_ffffffffffffff88);
    break;
  case 2:
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffff98;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff90,token);
    break;
  case 3:
    token_00.info = in_RDI;
    token_00._0_8_ = in_stack_ffffffffffffff98;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff90,token_00);
    break;
  case 4:
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)(in_RSI + 0x78));
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case 5:
    token_01.info = in_RDI;
    token_01._0_8_ = in_stack_ffffffffffffff98;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff90,token_01);
    break;
  case 6:
    not_null<slang::syntax::StatementSyntax_*>::get
              ((not_null<slang::syntax::StatementSyntax_*> *)(in_RSI + 0x90));
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RDI,in_stack_ffffffffffffff98);
  }
  return (TokenOrSyntax *)in_RDI;
}

Assistant:

TokenOrSyntax WaitStatementSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return wait;
        case 3: return openParen;
        case 4: return expr.get();
        case 5: return closeParen;
        case 6: return statement.get();
        default: return nullptr;
    }
}